

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O1

void __thiscall GusteauChapter2UI::Run(GusteauChapter2UI *this,ApplicationContextBase *ac)

{
  Blackboard *b;
  bool bVar1;
  int id;
  TypedData *d;
  size_t sVar2;
  long lVar3;
  long lVar4;
  ImVec2 local_50;
  long local_48;
  long local_40 [2];
  
  ImGui::Text("Hello Chapter 2");
  local_50.x = 0.0;
  local_50.y = 0.0;
  bVar1 = ImGui::Button("Quit",&local_50);
  if (bVar1) {
    csp_emit((CSP *)ac[2].super_enable_shared_from_this<ApplicationContextBase>._M_weak_this.
                    super___weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi,"quit",0);
  }
  sprintf(Run::tick_text,"tick: %d",
          (ulong)*(uint *)&ac[1].ui.super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         );
  ImGui::TextUnformatted(Run::tick_text,(char *)0x0);
  ImGui::InputText("Line: ",Run::buff,0x100,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
  local_50.x = 0.0;
  local_50.y = 0.0;
  bVar1 = ImGui::Button("Append",&local_50);
  if (bVar1) {
    b = *(Blackboard **)&ac[2].join_now;
    d = (TypedData *)operator_new(0x30);
    local_50 = (ImVec2)local_40;
    sVar2 = strlen(Run::buff);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,Run::buff,Run::buff + sVar2)
    ;
    (d->type)._M_target = (type_info *)&std::__cxx11::string::typeinfo;
    d->_vptr_TypedData = (_func_int **)&PTR__Data_001e1850;
    d[1]._vptr_TypedData = (_func_int **)(d + 2);
    std::__cxx11::string::_M_construct<char*>((string *)(d + 1),local_50,local_48 + (long)local_50);
    id = blackboard_new_entry(b,d);
    if (local_50 != (ImVec2)local_40) {
      operator_delete((void *)local_50,local_40[0] + 1);
    }
    csp_emit((CSP *)ac[2].super_enable_shared_from_this<ApplicationContextBase>._M_weak_this.
                    super___weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi,"append_line",id);
  }
  local_50.x = 0.0;
  local_50.y = 0.0;
  bVar1 = ImGui::Button("Pop",&local_50);
  if (bVar1) {
    csp_emit((CSP *)ac[2].super_enable_shared_from_this<ApplicationContextBase>._M_weak_this.
                    super___weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi,"pop_line",0);
  }
  ImGui::TextUnformatted("------ LINES ------",(char *)0x0);
  lVar3 = (long)ac[2]._vptr_ApplicationContextBase -
          (long)ac[1].ui.super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 5;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    lVar4 = 0;
    do {
      ImGui::TextUnformatted
                (*(char **)((long)&(ac[1].ui.
                                    super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar4),(char *)0x0)
      ;
      lVar4 = lVar4 + 0x20;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return;
}

Assistant:

virtual void Run(ApplicationContextBase& ac) override
    {
        auto ac_ptr = reinterpret_cast<ApplicationContext*>(&ac);

        ImGui::Text("Hello Chapter 2");
        if (ImGui::Button("Quit"))
        {
///>
/// The UI in chapter two uses the CSP mechanism to do it's work,
/// instead of setting variables on the ApplicationContext as it did previously.
///<C++
            csp_emit(ac_ptr->csp, "quit", 0);
        }
        static char tick_text[128];
        sprintf(tick_text, "tick: %d", ac_ptr->count);
        ImGui::TextUnformatted(tick_text);

        static char buff[256];
        ImGui::InputText("Line: ", buff, sizeof(buff));
        if (ImGui::Button("Append"))
        {
            int id = blackboard_new_entry(ac_ptr->blackboard, new Data<std::string>(std::string{buff}));
            csp_emit(ac_ptr->csp, "append_line", id);
        }
        if (ImGui::Button("Pop"))
        {
            csp_emit(ac_ptr->csp, "pop_line", 0);
        }
        ImGui::TextUnformatted("------ LINES ------");
        size_t sz = ac_ptr->lines.size();
        for (auto i = 0; i < sz; ++i)
        {
            ImGui::TextUnformatted(ac_ptr->lines[i].c_str());
        }
    }